

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_FunctionBuilder.h
# Opt level: O0

void __thiscall
soul::FunctionBuilder::addBranch
          (FunctionBuilder *this,Block *target,
          initializer_list<soul::pool_ref<soul::heart::Expression>_> targetArgs,
          pool_ptr<soul::heart::Block> *subsequentBlock)

{
  pool_ptr<soul::heart::Block> local_60;
  const_iterator local_58;
  pool_ref<soul::heart::Expression> *a;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<soul::pool_ref<soul::heart::Expression>_> *__range2;
  Branch *branch;
  pool_ptr<soul::heart::Block> *subsequentBlock_local;
  Block *target_local;
  FunctionBuilder *this_local;
  initializer_list<soul::pool_ref<soul::heart::Expression>_> targetArgs_local;
  
  targetArgs_local._M_array = (iterator)targetArgs._M_len;
  this_local = (FunctionBuilder *)targetArgs._M_array;
  branch = (Branch *)subsequentBlock;
  subsequentBlock_local = (pool_ptr<soul::heart::Block> *)target;
  target_local = (Block *)this;
  __range2 = (initializer_list<soul::pool_ref<soul::heart::Expression>_> *)
             Module::allocate<soul::heart::Branch,soul::heart::Block&>
                       ((this->super_BlockBuilder).module,target);
  __begin2 = (const_iterator)&this_local;
  __end2 = std::initializer_list<soul::pool_ref<soul::heart::Expression>_>::begin
                     ((initializer_list<soul::pool_ref<soul::heart::Expression>_> *)__begin2);
  a = std::initializer_list<soul::pool_ref<soul::heart::Expression>_>::end
                ((initializer_list<soul::pool_ref<soul::heart::Expression>_> *)__begin2);
  for (; __end2 != a; __end2 = __end2 + 1) {
    local_58 = __end2;
    ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL>::push_back
              ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Expression>,_4UL> *)
               (__range2 + 2),__end2);
  }
  local_60 = (pool_ptr<soul::heart::Block>)subsequentBlock->object;
  addTerminatorStatement(this,(Terminator *)__range2,&local_60);
  pool_ptr<soul::heart::Block>::~pool_ptr(&local_60);
  return;
}

Assistant:

void addBranch (heart::Block& target, std::initializer_list<pool_ref<heart::Expression>> targetArgs, pool_ptr<heart::Block> subsequentBlock)
    {
        auto& branch = module.allocate<heart::Branch> (target);

        for (auto& a : targetArgs)
            branch.targetArgs.push_back (a);

        addTerminatorStatement (branch, subsequentBlock);
    }